

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connector.hpp
# Opt level: O2

void __thiscall cpprofiler::Connector::sendOverSocket(Connector *this)

{
  vector<char,_std::allocator<char>_> buf;
  _Vector_base<char,_std::allocator<char>_> _Stack_28;
  
  if (this->_connected == true) {
    MessageMarshalling::serialize
              ((vector<char,_std::allocator<char>_> *)&_Stack_28,&this->marshalling);
    sendRawMsg(this,(vector<char,_std::allocator<char>_> *)&_Stack_28);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&_Stack_28);
  }
  return;
}

Assistant:

void sendOverSocket() {
    if (!_connected) return;

    std::vector<char> buf = marshalling.serialize();

    sendRawMsg(buf);
  }